

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.cpp
# Opt level: O3

interval_t __thiscall
duckdb::MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
          (MultiplyOperator *this,interval_t left,int64_t right)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  duckdb *this_00;
  interval_t iVar4;
  undefined1 auVar5 [16];
  int result;
  int local_4c;
  string local_48;
  
  this_00 = (duckdb *)left.micros;
  bVar1 = TryCast::Operation<long,int>((int64_t)this_00,&local_4c,false);
  if (bVar1) {
    iVar4.months = MultiplyOperatorOverflowCheck::Operation<int,int,int>((int)this,local_4c);
    iVar2 = MultiplyOperatorOverflowCheck::Operation<int,int,int>
                      ((int)((ulong)this >> 0x20),local_4c);
    lVar3 = MultiplyOperatorOverflowCheck::Operation<long,long,long>(left._0_8_,(long)this_00);
    iVar4.days = iVar2;
    iVar4.micros = lVar3;
    return iVar4;
  }
  auVar5 = __cxa_allocate_exception(0x10);
  CastExceptionText<long,int>(&local_48,this_00,auVar5._8_8_);
  InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_48);
  __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

interval_t MultiplyOperator::Operation(interval_t left, int64_t right) {
	const auto right32 = Cast::Operation<int64_t, int32_t>(right);
	left.months = MultiplyOperatorOverflowCheck::Operation<int32_t, int32_t, int32_t>(left.months, right32);
	left.days = MultiplyOperatorOverflowCheck::Operation<int32_t, int32_t, int32_t>(left.days, right32);
	left.micros = MultiplyOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(left.micros, right);
	return left;
}